

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

bool __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::setText
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,char *start,char *end)

{
  char *pcVar1;
  bool bVar2;
  undefined1 local_50 [24];
  string<char> s;
  char *p;
  char *end_local;
  char *start_local;
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this_local;
  
  pcVar1 = start;
  if ((long)end - (long)start < 3) {
    while ((s._8_8_ = pcVar1, (char *)s._8_8_ != end &&
           (bVar2 = isWhiteSpace(this,*(char *)s._8_8_), bVar2))) {
      pcVar1 = (char *)(s._8_8_ + 1);
    }
    if ((char *)s._8_8_ == end) {
      return false;
    }
  }
  p._0_4_ = (int)end;
  core::string<char>::string<char>((string<char> *)(local_50 + 0x10),start,(int)p - (int)start);
  replaceSpecialCharacters((CXMLReaderImpl<char,_irr::io::IXMLBase> *)local_50,(string<char> *)this)
  ;
  core::string<char>::operator=(&this->NodeName,(string<char> *)local_50);
  core::string<char>::~string((string<char> *)local_50);
  this->CurrentNodeType = EXN_TEXT;
  core::string<char>::~string((string<char> *)(local_50 + 0x10));
  return true;
}

Assistant:

bool setText(char_type* start, char_type* end)
	{
		// check if text is more than 2 characters, and if not, check if there is 
		// only white space, so that this text won't be reported
		if (end - start < 3)
		{
			char_type* p = start;
			for(; p != end; ++p)
				if (!isWhiteSpace(*p))
					break;

			if (p == end)
				return false;
		}

		// set current text to the parsed text, and replace xml special characters
		core::string<char_type> s(start, (int)(end - start));
		NodeName = replaceSpecialCharacters(s);

		// current XML node type is text
		CurrentNodeType = EXN_TEXT;

		return true;
	}